

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# high_register_operations.c
# Opt level: O2

void high_register_operations(arm7tdmi_t *state,thumbinstr_t *thminstr)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t *puVar4;
  status_register_t *psVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint32_t *puVar9;
  ushort uVar10;
  uint uVar11;
  char *pcVar12;
  uint uVar13;
  undefined8 uStack_50;
  
  uVar1 = thminstr->raw;
  uVar6 = uVar1 & 0x80;
  uVar10 = uVar1 >> 8 & 3;
  uVar3 = (uint)uVar1;
  if ((uVar1 & 0xc0) != 0) {
    switch(uVar10) {
    case 0:
      uVar13 = uVar6 >> 4 | uVar3 & 7;
      uVar11 = ((uVar3 & 0x40) >> 3 | 7) & (uint)(uVar1 >> 3);
      uVar3 = (state->cpsr).raw;
      uVar6 = uVar3 & 0x1f;
      if (uVar11 - 8 < 5 && uVar6 == 0x11) {
        puVar4 = state->highreg_fiq + (uVar11 - 8);
      }
      else if ((ushort)uVar11 < 0xd) {
        puVar4 = state->r + uVar11;
      }
      else if ((ushort)uVar11 == 0xe) {
        switch(uVar6) {
        case 0x11:
          puVar4 = &state->lr_fiq;
          break;
        case 0x12:
          puVar4 = &state->lr_irq;
          break;
        case 0x13:
          puVar4 = &state->lr_svc;
          break;
        default:
          puVar4 = &state->lr;
          break;
        case 0x17:
          puVar4 = &state->lr_abt;
          break;
        case 0x1b:
          puVar4 = &state->lr_und;
        }
      }
      else if (uVar11 == 0xd) {
        switch(uVar6) {
        case 0x11:
          puVar4 = &state->sp_fiq;
          break;
        case 0x12:
          puVar4 = &state->sp_irq;
          break;
        case 0x13:
          puVar4 = &state->sp_svc;
          break;
        default:
          puVar4 = &state->sp;
          break;
        case 0x17:
          puVar4 = &state->sp_abt;
          break;
        case 0x1b:
          puVar4 = &state->sp_und;
        }
      }
      else {
        puVar4 = &state->pc;
      }
      uVar11 = uVar13 - 8;
      if (uVar11 < 5 && uVar6 == 0x11) {
        puVar9 = state->highreg_fiq + uVar11;
      }
      else if ((ushort)uVar13 < 0xd) {
        puVar9 = state->r + uVar13;
      }
      else if (uVar13 == 0xe) {
        switch(uVar6) {
        case 0x11:
          puVar9 = &state->lr_fiq;
          break;
        case 0x12:
          puVar9 = &state->lr_irq;
          break;
        case 0x13:
          puVar9 = &state->lr_svc;
          break;
        default:
          puVar9 = &state->lr;
          break;
        case 0x17:
          puVar9 = &state->lr_abt;
          break;
        case 0x1b:
          puVar9 = &state->lr_und;
        }
      }
      else if (uVar13 == 0xd) {
        switch(uVar6) {
        case 0x11:
          puVar9 = &state->sp_fiq;
          break;
        case 0x12:
          puVar9 = &state->sp_irq;
          break;
        case 0x13:
          puVar9 = &state->sp_svc;
          break;
        default:
          puVar9 = &state->sp;
          break;
        case 0x17:
          puVar9 = &state->sp_abt;
          break;
        case 0x1b:
          puVar9 = &state->sp_und;
        }
      }
      else {
        puVar9 = &state->pc;
      }
      uVar7 = *puVar4 + *puVar9;
      uVar6 = uVar7 | 1;
      uVar2 = uVar7;
      if (uVar13 == 0xf) {
        uVar2 = uVar6;
      }
      if (2 < gba_log_verbosity) {
        printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar13,(ulong)uVar2);
        uVar3 = (state->cpsr).raw;
      }
      uVar8 = uVar3 & 0x1f;
      if (uVar8 == 0x11 && uVar11 < 5) {
        state->highreg_fiq[uVar11] = uVar2;
        return;
      }
      if ((ushort)uVar13 < 0xd) {
        state->r[uVar13] = uVar7;
        return;
      }
      if (uVar13 == 0xe) {
        switch(uVar8) {
        case 0x11:
          state->lr_fiq = uVar7;
          return;
        case 0x12:
          state->lr_irq = uVar7;
          return;
        case 0x13:
          state->lr_svc = uVar7;
          return;
        default:
          state->lr = uVar7;
          return;
        case 0x17:
          state->lr_abt = uVar7;
          return;
        case 0x1b:
          state->lr_und = uVar7;
          return;
        }
      }
      if (uVar13 == 0xd) {
        switch(uVar8) {
        case 0x11:
          state->sp_fiq = uVar7;
          return;
        case 0x12:
          state->sp_irq = uVar7;
          return;
        case 0x13:
          state->sp_svc = uVar7;
          return;
        default:
          state->sp = uVar7;
          return;
        case 0x17:
          state->sp_abt = uVar7;
          return;
        case 0x1b:
          state->sp_und = uVar7;
          return;
        }
      }
      if ((uVar3 & 0x20) == 0) {
        uVar6 = uVar7 & 0xfffffffe;
      }
      goto LAB_00109bc7;
    case 1:
      uVar11 = uVar6 >> 4 | uVar3 & 7;
      uVar6 = ((uVar3 & 0x40) >> 3 | 7) & (uint)(uVar1 >> 3);
      uVar3 = (state->cpsr).raw & 0x1f;
      if (uVar6 - 8 < 5 && uVar3 == 0x11) {
        puVar4 = state->highreg_fiq + (uVar6 - 8);
      }
      else if ((ushort)uVar6 < 0xd) {
        puVar4 = state->r + uVar6;
      }
      else if ((ushort)uVar6 == 0xe) {
        switch(uVar3) {
        case 0x11:
          puVar4 = &state->lr_fiq;
          break;
        case 0x12:
          puVar4 = &state->lr_irq;
          break;
        case 0x13:
          puVar4 = &state->lr_svc;
          break;
        default:
          puVar4 = &state->lr;
          break;
        case 0x17:
          puVar4 = &state->lr_abt;
          break;
        case 0x1b:
          puVar4 = &state->lr_und;
        }
      }
      else if (uVar6 == 0xd) {
        switch(uVar3) {
        case 0x11:
          puVar4 = &state->sp_fiq;
          break;
        case 0x12:
          puVar4 = &state->sp_irq;
          break;
        case 0x13:
          puVar4 = &state->sp_svc;
          break;
        default:
          puVar4 = &state->sp;
          break;
        case 0x17:
          puVar4 = &state->sp_abt;
          break;
        case 0x1b:
          puVar4 = &state->sp_und;
        }
      }
      else {
        puVar4 = &state->pc;
      }
      uVar6 = *puVar4;
      if (uVar11 - 8 < 5 && uVar3 == 0x11) {
        puVar4 = state->highreg_fiq + (uVar11 - 8);
      }
      else if ((ushort)uVar11 < 0xd) {
        puVar4 = state->r + uVar11;
      }
      else if (uVar11 == 0xe) {
        switch(uVar3) {
        case 0x11:
          puVar4 = &state->lr_fiq;
          break;
        case 0x12:
          puVar4 = &state->lr_irq;
          break;
        case 0x13:
          puVar4 = &state->lr_svc;
          break;
        default:
          puVar4 = &state->lr;
          break;
        case 0x17:
          puVar4 = &state->lr_abt;
          break;
        case 0x1b:
          puVar4 = &state->lr_und;
        }
      }
      else if (uVar11 == 0xd) {
        switch(uVar3) {
        case 0x11:
          puVar4 = &state->sp_fiq;
          break;
        case 0x12:
          puVar4 = &state->sp_irq;
          break;
        case 0x13:
          puVar4 = &state->sp_svc;
          break;
        default:
          puVar4 = &state->sp;
          break;
        case 0x17:
          puVar4 = &state->sp_abt;
          break;
        case 0x1b:
          puVar4 = &state->sp_und;
        }
      }
      else {
        puVar4 = &state->pc;
      }
      uVar3 = *puVar4;
      uVar11 = uVar3 - uVar6;
      (state->cpsr).raw =
           (~(uVar6 ^ uVar11) & (uVar3 ^ uVar6)) >> 3 & 0x10000000 |
           (state->cpsr).raw & 0xcfffffff | (uint)(uVar6 <= uVar3) << 0x1d;
      psVar5 = get_psr(state);
      psVar5->raw = uVar11 & 0x80000000 | (uint)(uVar11 == 0) << 0x1e | psVar5->raw & 0x3fffffff;
      break;
    case 2:
      uVar13 = uVar6 >> 4 | uVar3 & 7;
      uVar11 = ((uVar3 & 0x40) >> 3 | 7) & (uint)(uVar1 >> 3);
      uVar3 = (state->cpsr).raw;
      uVar6 = uVar3 & 0x1f;
      if (uVar11 - 8 < 5 && uVar6 == 0x11) {
        puVar4 = state->highreg_fiq + (uVar11 - 8);
      }
      else if ((ushort)uVar11 < 0xd) {
        puVar4 = state->r + uVar11;
      }
      else if ((ushort)uVar11 == 0xe) {
        switch(uVar6) {
        case 0x11:
          puVar4 = &state->lr_fiq;
          break;
        case 0x12:
          puVar4 = &state->lr_irq;
          break;
        case 0x13:
          puVar4 = &state->lr_svc;
          break;
        default:
          puVar4 = &state->lr;
          break;
        case 0x17:
          puVar4 = &state->lr_abt;
          break;
        case 0x1b:
          puVar4 = &state->lr_und;
        }
      }
      else if (uVar11 == 0xd) {
        switch(uVar6) {
        case 0x11:
          puVar4 = &state->sp_fiq;
          break;
        case 0x12:
          puVar4 = &state->sp_irq;
          break;
        case 0x13:
          puVar4 = &state->sp_svc;
          break;
        default:
          puVar4 = &state->sp;
          break;
        case 0x17:
          puVar4 = &state->sp_abt;
          break;
        case 0x1b:
          puVar4 = &state->sp_und;
        }
      }
      else {
        puVar4 = &state->pc;
      }
      uVar11 = *puVar4;
      uVar6 = uVar11 | 1;
      uVar2 = uVar11;
      if (uVar13 == 0xf) {
        uVar2 = uVar6;
      }
      if (2 < gba_log_verbosity) {
        printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar13,(ulong)uVar2);
        uVar3 = (state->cpsr).raw;
      }
      uVar7 = uVar3 & 0x1f;
      if (uVar13 - 8 < 5 && uVar7 == 0x11) {
        state->highreg_fiq[uVar13 - 8] = uVar2;
      }
      else if ((ushort)uVar13 < 0xd) {
        state->r[uVar13] = uVar11;
      }
      else if (uVar13 == 0xe) {
        switch(uVar7) {
        case 0x11:
          state->lr_fiq = uVar11;
          break;
        case 0x12:
          state->lr_irq = uVar11;
          break;
        case 0x13:
          state->lr_svc = uVar11;
          break;
        default:
          state->lr = uVar11;
          break;
        case 0x17:
          state->lr_abt = uVar11;
          break;
        case 0x1b:
          state->lr_und = uVar11;
        }
      }
      else {
        if (uVar13 != 0xd) {
          if ((uVar3 & 0x20) == 0) {
            uVar6 = uVar11 & 0xfffffffe;
          }
          goto LAB_00109bc7;
        }
        switch(uVar7) {
        case 0x11:
          state->sp_fiq = uVar11;
          break;
        case 0x12:
          state->sp_irq = uVar11;
          break;
        case 0x13:
          state->sp_svc = uVar11;
          break;
        default:
          state->sp = uVar11;
          break;
        case 0x17:
          state->sp_abt = uVar11;
          break;
        case 0x1b:
          state->sp_und = uVar11;
        }
      }
      break;
    case 3:
      goto switchD_001098bd_caseD_3;
    }
    return;
  }
  switch(uVar10) {
  case 0:
    uStack_50 = 6;
    break;
  case 1:
    uStack_50 = 7;
    break;
  case 2:
    uStack_50 = 8;
    break;
  case 3:
switchD_001098bd_caseD_3:
    if ((short)uVar6 == 0) {
      if ((uVar1 & 0x40) == 0) {
        puVar4 = state->r + (uVar1 >> 3 & 7);
      }
      else {
        uVar6 = uVar1 >> 3 & 0xf;
        uVar3 = (state->cpsr).raw & 0x1f;
        if (uVar6 - 8 < 5 && uVar3 == 0x11) {
          puVar4 = state->highreg_fiq + (uVar6 - 8);
        }
        else if ((ushort)uVar6 < 0xd) {
          puVar4 = state->r + uVar6;
        }
        else if ((ushort)uVar6 == 0xe) {
          switch(uVar3) {
          case 0x11:
            puVar4 = &state->lr_fiq;
            break;
          case 0x12:
            puVar4 = &state->lr_irq;
            break;
          case 0x13:
            puVar4 = &state->lr_svc;
            break;
          default:
            puVar4 = &state->lr;
            break;
          case 0x17:
            puVar4 = &state->lr_abt;
            break;
          case 0x1b:
            puVar4 = &state->lr_und;
          }
        }
        else if (uVar6 == 0xd) {
          switch(uVar3) {
          case 0x11:
            puVar4 = &state->sp_fiq;
            break;
          case 0x12:
            puVar4 = &state->sp_irq;
            break;
          case 0x13:
            puVar4 = &state->sp_svc;
            break;
          default:
            puVar4 = &state->sp;
            break;
          case 0x17:
            puVar4 = &state->sp_abt;
            break;
          case 0x1b:
            puVar4 = &state->sp_und;
          }
        }
        else {
          puVar4 = &state->pc;
        }
      }
      uVar6 = *puVar4;
      if (((1 < gba_log_verbosity) &&
          (printf("\x1b[0;36m[INFO]  Hold on to your (high register operations) hats, we\'re jumping to 0x%02X\n\x1b[0;m"
                  ,(ulong)uVar6), (uVar6 & 1) == 0)) && (2 < gba_log_verbosity)) {
        puts("[DEBUG] REALLY hang on, we\'re exiting THUMB mode!");
      }
LAB_00109bc7:
      set_pc(state,uVar6);
      return;
    }
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/high_register_operations.c"
            ,0x2c);
    pcVar12 = "INVALID setting for h1";
    goto LAB_0010a423;
  }
  fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
          "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/high_register_operations.c"
          ,uStack_50);
  pcVar12 = "Invalid flag combination!";
LAB_0010a423:
  fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m",pcVar12);
  exit(1);
}

Assistant:

void high_register_operations(arm7tdmi_t* state, thumbinstr_t* thminstr) {
    high_register_operations_t* instr = &thminstr->HIGH_REGISTER_OPERATIONS;
    if (instr->h1 == 0 && instr->h2 == 0) {
        unimplemented(instr->opcode == 0b00, "Invalid flag combination!")
        unimplemented(instr->opcode == 0b01, "Invalid flag combination!")
        unimplemented(instr->opcode == 0b10, "Invalid flag combination!")
    }
    switch (instr->opcode) {
        case 0b00: { // ADD
            int adj_rd = instr->h1 ? instr->rdhd + 8 : instr->rdhd;
            int adj_rs = instr->h2 ? instr->rshs + 8 : instr->rshs;
            word rsdata = get_register(state, adj_rs);
            word rddata = get_register(state, adj_rd);
            word result = rsdata + rddata;
            if (adj_rd == REG_PC) {
                result |= 1; // Set thumb mode bit
            }
            set_register(state, adj_rd, result);
            break;
        }
        case 0b01: { // CMP (only one that sets condition codes in this group)
            int adj_rd = instr->h1 ? instr->rdhd + 8 : instr->rdhd;
            int adj_rs = instr->h2 ? instr->rshs + 8 : instr->rshs;
            word rsdata = get_register(state, adj_rs);
            word rddata = get_register(state, adj_rd);
            word result = rddata - rsdata;
            set_flags_sub(state, rddata, rsdata, result);
            set_flags_nz(state, result);
            break;
        }
        case 0b10: { // MOV
            int adj_rd = instr->h1 ? instr->rdhd + 8 : instr->rdhd;
            int adj_rs = instr->h2 ? instr->rshs + 8 : instr->rshs;
            word source_data = get_register(state, adj_rs);
            if (adj_rd == REG_PC) {
                source_data |= 1; // Set thumb mode bit
            }
            set_register(state, adj_rd, source_data);
            break;
        }
        case 0b11: { // BX
            unimplemented(instr->h1 == 1, "INVALID setting for h1")
            word newpc;
            if (instr->h2) {
                newpc = get_register(state, instr->rshs + 8);
            } else {
                newpc = get_register(state, instr->rshs);
            }

            bool thumb = newpc & 1u;
            loginfo("Hold on to your (high register operations) hats, we're jumping to 0x%02X", newpc)
            if (!thumb) logdebug("REALLY hang on, we're exiting THUMB mode!")
            set_pc(state, newpc);
            break;
        }
    }
}